

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocation.cc
# Opt level: O1

void * bas::aligned_malloc_fallback(size_t size,size_t alignment)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = malloc(size + alignment + 3);
  if (pvVar1 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(-alignment & (long)pvVar1 + alignment + 3);
    *(int *)((long)pvVar2 + -4) = (int)pvVar2 - (int)pvVar1;
  }
  return pvVar2;
}

Assistant:

void *aligned_malloc_fallback(size_t size, size_t alignment)
{
    size_t malloc_size = size + sizeof(MemHeader) + alignment - 1;
    uintptr_t real_ptr = ptr_to_int(malloc(malloc_size));
    if (real_ptr == 0) {
        return nullptr;
    }

    uintptr_t aligned_ptr = (real_ptr + sizeof(MemHeader) + alignment - 1) &
                            ~(alignment - 1);
    MemHeader *head = int_to_ptr<MemHeader>(aligned_ptr - sizeof(MemHeader));
    head->offset = (int)(aligned_ptr - real_ptr);

    return int_to_ptr<void>(aligned_ptr);
}